

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

bool boost::xpressive::detail::
     advance_to_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,long>
               (long *iter,long diff,long end)

{
  long lVar1;
  
  if (diff < 1) {
    lVar1 = *iter;
    if ((-1 < diff) || (SBORROW8(lVar1 - end,-diff) == (lVar1 - end) + diff < 0)) goto LAB_0012e55b;
  }
  else {
    lVar1 = *iter;
    if (diff <= end - lVar1) {
LAB_0012e55b:
      *iter = lVar1 + diff;
      return true;
    }
  }
  return false;
}

Assistant:

inline bool advance_to_impl(RandIter & iter, Diff diff, RandIter end, std::random_access_iterator_tag)
{
    if(0 < diff)
    {
        if((end - iter) < diff)
            return false;
    }
    else if(0 > diff)
    {
        if((iter - end) < -diff)
            return false;
    }
    iter += diff;
    return true;
}